

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8d_parser.c
# Opt level: O0

void vp8d_unref_frame(VP8DParserContext_t *p,VP8Frame *frame)

{
  MppBuffer local_20;
  MppBuffer framebuf;
  VP8Frame *frame_local;
  VP8DParserContext_t *p_local;
  
  framebuf = frame;
  frame_local = (VP8Frame *)p;
  if ((vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0xff,"vp8d_unref_frame"
              );
  }
  if (((framebuf == (MppBuffer)0x0) || (*(char *)((long)framebuf + 0xc) < '\x01')) ||
     (0x7e < *(int *)((long)framebuf + 8))) {
    _mpp_log_l(2,"vp8d_parser","ref count alreay is zero",(char *)0x0);
    if ((vp8d_debug & 1) != 0) {
      _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",0x103,
                 "vp8d_unref_frame");
    }
  }
  else {
    *(char *)((long)framebuf + 0xc) = *(char *)((long)framebuf + 0xc) + -1;
    if (*(char *)((long)framebuf + 0xc) == '\0') {
      if (*(int *)((long)framebuf + 8) < 0x7f) {
        local_20 = (MppBuffer)0x0;
        if (*(char *)((long)framebuf + 0xd) != '\0') {
          mpp_buf_slot_get_prop
                    (*(MppBufSlots *)&frame_local[0xac].slot_index,*(RK_S32 *)((long)framebuf + 8),
                     SLOT_BUFFER,&local_20);
          mpp_buffer_put_with_caller(local_20,"vp8d_unref_frame");
          *(undefined1 *)((long)framebuf + 0xd) = 0;
        }
        mpp_buf_slot_clr_flag
                  (*(MppBufSlots *)&frame_local[0xac].slot_index,*(RK_S32 *)((long)framebuf + 8),
                   SLOT_CODEC_USE);
      }
      *(undefined4 *)((long)framebuf + 8) = 0xff;
      mpp_frame_deinit((MppFrame *)framebuf);
      mpp_osal_free("vp8d_unref_frame",framebuf);
      framebuf = (MppBuffer)0x0;
    }
    if ((vp8d_debug & 1) != 0) {
      _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",0x118,
                 "vp8d_unref_frame");
    }
  }
  return;
}

Assistant:

static void vp8d_unref_frame(VP8DParserContext_t *p, VP8Frame *frame)
{

    FUN_T("FUN_IN");
    if (NULL == frame || frame->ref_count <= 0
        || frame->slot_index >= 0x7f) {
        mpp_err("ref count alreay is zero");
        FUN_T("FUN_OUT");
        return;
    }

    frame->ref_count--;
    if (!frame->ref_count) {
        if (frame->slot_index < 0x7f) {
            MppBuffer framebuf = NULL;
            if (frame->invisible) {
                mpp_buf_slot_get_prop(p->frame_slots, frame->slot_index, SLOT_BUFFER, &framebuf);
                mpp_buffer_put(framebuf);
                frame->invisible = 0;
            }
            mpp_buf_slot_clr_flag(p->frame_slots, frame->slot_index, SLOT_CODEC_USE);
        }
        frame->slot_index = 0xff;
        mpp_frame_deinit(&frame->f);
        mpp_free(frame);
        frame = NULL;
    }

    FUN_T("FUN_OUT");
    return;
}